

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O3

string * __thiscall
viface::VIfaceImpl::ioctlGetIPv4_abi_cxx11_
          (string *__return_storage_ptr__,VIfaceImpl *this,unsigned_long request)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  int *piVar6;
  runtime_error *prVar7;
  char addr [16];
  ifreq ifr;
  ostringstream what;
  char local_218 [16];
  string local_208 [32];
  string local_1e8;
  ifreq local_1c8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar2 = this->kernel_socket;
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (this->name)._M_string_length);
  read_flags(iVar2,&local_1e8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  iVar2 = ioctl(this->kernel_socket,request,&local_1c8);
  if (iVar2 == 0) {
    local_218[0] = '\0';
    local_218[1] = '\0';
    local_218[2] = '\0';
    local_218[3] = '\0';
    local_218[4] = '\0';
    local_218[5] = '\0';
    local_218[6] = '\0';
    local_218[7] = '\0';
    local_218[8] = '\0';
    local_218[9] = '\0';
    local_218[10] = '\0';
    local_218[0xb] = '\0';
    local_218[0xc] = '\0';
    local_218[0xd] = '\0';
    local_218[0xe] = '\0';
    local_218[0xf] = '\0';
    pcVar3 = inet_ntop(2,(void *)((long)&local_1c8.ifr_ifru + 4),local_218,0x10);
    if (pcVar3 != (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar4 = strlen(local_218);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_218,local_218 + sVar4);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      std::ios_base::~ios_base(local_130);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"--- Unable to convert IPv4 for ",0x1f);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(this->name)._M_dataplus._M_p,
                        (this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"    Error: ",0xb);
    piVar6 = __errno_location();
    pcVar3 = strerror(*piVar6);
    std::operator<<((ostream *)local_1a0,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," (",2);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,*piVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,").",2);
    std::endl<char,std::char_traits<char>>(poVar5);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,local_208);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"--- Unable to get IPv4 for ",0x1b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"    Error: ",0xb);
  piVar6 = __errno_location();
  pcVar3 = strerror(*piVar6);
  std::operator<<((ostream *)local_1a0,pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," (",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,*piVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,").",2);
  std::endl<char,std::char_traits<char>>(poVar5);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,local_208);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string VIfaceImpl::ioctlGetIPv4(unsigned long request) const
{
    ostringstream what;

    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    if (ioctl(this->kernel_socket, request, &ifr) != 0) {
        what << "--- Unable to get IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Convert binary IP address to string
    char addr[INET_ADDRSTRLEN];
    memset(&addr, 0, sizeof(addr));

    struct sockaddr_in* ipaddr = (struct sockaddr_in*) &ifr.ifr_addr;
    if (inet_ntop(AF_INET, &(ipaddr->sin_addr), addr, sizeof(addr)) == NULL) {
        what << "--- Unable to convert IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return string(addr);
}